

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  undefined1 uVar8;
  byte *pbVar9;
  char *pcVar10;
  byte *pbVar11;
  
  if (end <= ptr) {
    return -4;
  }
  uVar7 = (long)end - (long)ptr;
  pbVar9 = (byte *)(ptr + (uVar7 & 0xfffffffffffffffe));
  if ((uVar7 & 0xfffffffffffffffe) == 0) {
    pbVar9 = (byte *)end;
  }
  if ((uVar7 & 1) == 0) {
    pbVar9 = (byte *)end;
  }
  if (uVar7 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_007624a4:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_007624a4;
    uVar8 = 0;
  }
  bVar2 = false;
  iVar4 = 0x12;
  switch(uVar8) {
  case 2:
    if ((long)pbVar9 - (long)(ptr + 2) < 2) {
      return -1;
    }
    bVar1 = ptr[2];
    if (bVar1 < 0xdc) {
      bVar3 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        }
        else {
LAB_007629b9:
          bVar3 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar3 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto LAB_007629b9;
      bVar3 = 0;
    }
    switch(bVar3) {
    case 0xf:
      iVar4 = big2_scanPi(enc,ptr + 4,(char *)pbVar9,nextTokPtr);
      return iVar4;
    case 0x10:
      iVar4 = big2_scanDecl(enc,ptr + 4,(char *)pbVar9,nextTokPtr);
      return iVar4;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_007629e3_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar3 - 5 < 3) || (bVar3 == 0x1d)) goto switchD_007629e3_caseD_16;
    }
switchD_00762997_default:
    *nextTokPtr = ptr + 2;
    goto LAB_00762945;
  default:
switchD_007624ca_caseD_3:
    *nextTokPtr = ptr;
    return 0;
  case 4:
    pcVar10 = ptr + 2;
    iVar4 = -0x1a;
    if (1 < (long)pbVar9 - (long)pcVar10) {
      if ((*pcVar10 == '\0') && (ptr[3] == ']')) {
        if ((long)pbVar9 - (long)pcVar10 < 4) {
          return -1;
        }
        if ((ptr[4] == '\0') && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar10;
      iVar4 = 0x1a;
    }
    break;
  case 5:
    if ((long)pbVar9 - (long)ptr < 2) {
      return -2;
    }
    goto LAB_00762942;
  case 6:
    if ((long)pbVar9 - (long)ptr < 3) {
      return -2;
    }
    goto LAB_00762942;
  case 7:
    if ((long)pbVar9 - (long)ptr < 4) {
      return -2;
    }
LAB_00762942:
    *nextTokPtr = ptr;
LAB_00762945:
    iVar4 = 0;
    break;
  case 9:
    if ((byte *)(ptr + 2) == pbVar9) {
      *nextTokPtr = (char *)pbVar9;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar11 = (byte *)(ptr + 2);
    for (lVar5 = (long)pbVar9 - (long)pbVar11; 1 < lVar5; lVar5 = lVar5 + -2) {
      bVar1 = *pbVar11;
      if (bVar1 < 0xdc) {
        cVar6 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar6 = *(char *)((long)enc[1].scanners + (ulong)pbVar11[1]);
          }
          else {
LAB_007627ef:
            cVar6 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar6 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || (pbVar11[1] < 0xfe)) goto LAB_007627ef;
        cVar6 = '\0';
      }
      if (((cVar6 != '\x15') && (cVar6 != '\n')) && ((cVar6 != '\t' || (pbVar11 + 2 == pbVar9))))
      break;
      pbVar11 = pbVar11 + 2;
    }
    *nextTokPtr = (char *)pbVar11;
    iVar4 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar4 = 0x11;
    break;
  case 0xc:
    iVar4 = 0xc;
    goto LAB_0076285e;
  case 0xd:
    iVar4 = 0xd;
LAB_0076285e:
    iVar4 = big2_scanLit(iVar4,enc,ptr + 2,(char *)pbVar9,nextTokPtr);
    return iVar4;
  case 0x13:
    iVar4 = big2_scanPoundName(enc,ptr + 2,(char *)pbVar9,nextTokPtr);
    return iVar4;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar4 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_007624ca_caseD_16;
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_007624ca_caseD_19;
  case 0x1d:
    bVar3 = ptr[1];
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar3 >> 5) * 4))
         >> (bVar3 & 0x1f) & 1) != 0) {
      bVar2 = false;
      goto switchD_007624ca_caseD_16;
    }
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 +
                         (uint)(bVar3 >> 5) * 4)) & 1 << (bVar3 & 0x1f)) == 0)
    goto switchD_007624ca_caseD_3;
    goto switchD_007624ca_caseD_19;
  case 0x1e:
    iVar4 = big2_scanPercent(enc,ptr + 2,(char *)pbVar9,nextTokPtr);
    return iVar4;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar4 = 0x17;
    break;
  case 0x20:
    pbVar11 = (byte *)(ptr + 2);
    if ((long)pbVar9 - (long)pbVar11 < 2) {
      return -0x18;
    }
    bVar1 = *pbVar11;
    if (bVar1 < 0xdc) {
      bVar3 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        }
        else {
LAB_0076295f:
          bVar3 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      bVar3 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto LAB_0076295f;
      bVar3 = 0;
    }
    if (bVar3 < 0x20) {
      if (2 < bVar3 - 9) {
        if (bVar3 == 0xf) {
          *nextTokPtr = ptr + 4;
          return 0x23;
        }
        if (bVar3 != 0x15) goto switchD_00762997_default;
      }
switchD_00762997_caseD_20:
      *nextTokPtr = (char *)pbVar11;
      iVar4 = 0x18;
    }
    else {
      switch(bVar3) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_00762997_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 4;
        iVar4 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 4;
        iVar4 = 0x25;
        break;
      default:
        goto switchD_00762997_default;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar4 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar4 = 0x15;
  }
  return iVar4;
switchD_007624ca_caseD_19:
  iVar4 = 0x13;
  bVar2 = true;
switchD_007624ca_caseD_16:
  pbVar9 = pbVar9 + (-2 - (long)ptr);
  if ((long)pbVar9 < 2) {
LAB_007625a7:
    return -iVar4;
  }
  pcVar10 = ptr + 4;
LAB_007624fd:
  bVar1 = pcVar10[-2];
  if (bVar1 < 0xdc) {
    uVar8 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar8 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)pcVar10[-1]);
      }
      else {
LAB_00762550:
        uVar8 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar8 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)pcVar10[-1] < 0xfe)) goto LAB_00762550;
    uVar8 = 0;
  }
  switch(uVar8) {
  case 6:
    if (pbVar9 == (byte *)0x2) {
      return -2;
    }
    break;
  case 7:
    if ((long)pbVar9 < 4) {
      return -2;
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0x14:
  case 0x15:
  case 0x1e:
  case 0x20:
  case 0x23:
  case 0x24:
    *nextTokPtr = pcVar10 + -2;
    return iVar4;
  case 0xf:
    if (!bVar2) {
      *nextTokPtr = pcVar10;
      return 0x1e;
    }
    break;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0076256c_caseD_16;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)pcVar10[-1] >> 3 & 0x1c |
                         (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
         ((byte)pcVar10[-1] & 0x1f) & 1) != 0) goto switchD_0076256c_caseD_16;
    break;
  case 0x21:
    if (!bVar2) {
      *nextTokPtr = pcVar10;
      return 0x1f;
    }
    break;
  case 0x22:
    if (!bVar2) {
      *nextTokPtr = pcVar10;
      return 0x20;
    }
  }
  ptr = pcVar10 + -2;
  goto LAB_00762942;
switchD_0076256c_caseD_16:
  pbVar9 = pbVar9 + -2;
  pcVar10 = pcVar10 + 2;
  if ((long)pbVar9 < 2) goto LAB_007625a7;
  goto LAB_007624fd;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}